

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_helpers.hpp
# Opt level: O2

void duckdb::AddToHugeint::AddValue(hugeint_t *result,uint64_t value,int positive)

{
  ulong uVar1;
  
  uVar1 = result->lower;
  result->lower = result->lower + value;
  if ((uint)CARRY8(uVar1,value) == positive) {
    result->upper = result->upper + (ulong)(uint)positive * 2 + -1;
  }
  return;
}

Assistant:

static void AddValue(hugeint_t &result, uint64_t value, int positive) {
		// integer summation taken from Tim Gubner et al. - Efficient Query Processing
		// with Optimistically Compressed Hash Tables & Strings in the USSR

		// add the value to the lower part of the hugeint
		result.lower += value;
		// now handle overflows
		int overflow = result.lower < value;
		// we consider two situations:
		// (1) input[idx] is positive, and current value is lower than value: overflow
		// (2) input[idx] is negative, and current value is higher than value: underflow
		if (!(overflow ^ positive)) {
			// in the case of an overflow or underflow we either increment or decrement the upper base
			// positive: +1, negative: -1
			result.upper += -1 + 2 * positive;
		}
	}